

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_archive.cpp
# Opt level: O2

void __thiscall
boost::archive::json_archive::push_obj_repository
          (json_archive *this,uint32_t class_id,uint32_t obj_id)

{
  string local_48;
  
  local_48._M_dataplus._M_p._0_4_ =
       (undefined4)
       ((ulong)((long)(this->data_stack_).
                      super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->data_stack_).
                     super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                     ._M_impl.super__Vector_impl_data._M_start) >> 3);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->data_mark_,(int *)&local_48);
  std::
  vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
  ::push_back(&this->data_stack_,&this->obj_repository_);
  std::__cxx11::to_string(&local_48,class_id);
  push_data(this,(char *)CONCAT44(local_48._M_dataplus._M_p._4_4_,local_48._M_dataplus._M_p._0_4_));
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::to_string(&local_48,obj_id);
  push_data(this,(char *)CONCAT44(local_48._M_dataplus._M_p._4_4_,local_48._M_dataplus._M_p._0_4_));
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void json_archive::push_obj_repository(const uint32_t class_id, const uint32_t obj_id)
{
    data_mark_.push_back(data_stack_.size());
    data_stack_.push_back(obj_repository_);

    push_data(std::to_string(class_id).c_str());
    push_data(std::to_string(obj_id).c_str());
}